

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O1

bool __thiscall
ELFIO::segment_impl<ELFIO::Elf64_Phdr>::load_data(segment_impl<ELFIO::Elf64_Phdr> *this)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  const_iterator __begin2;
  undefined4 extraout_var;
  pointer paVar4;
  ulong uVar5;
  char *pcVar6;
  long *plVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  undefined4 extraout_var_00;
  
  iVar3 = (*(this->super_segment)._vptr_segment[3])();
  bVar10 = true;
  if ((iVar3 != 0) &&
     (iVar3 = (*(this->super_segment)._vptr_segment[0xd])(this), CONCAT44(extraout_var,iVar3) != 0))
  {
    uVar1 = (this->ph).p_offset;
    uVar9 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
            (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
            (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    if (this->convertor->need_conversion == false) {
      uVar9 = uVar1;
    }
    for (paVar4 = (this->translator->addr_translations).
                  super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        paVar4 != (this->translator->addr_translations).
                  super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                  ._M_impl.super__Vector_impl_data._M_finish; paVar4 = paVar4 + 0x30) {
      lVar8 = uVar9 - *(long *)paVar4;
      if ((*(long *)paVar4 <= (long)uVar9) && (lVar8 < *(long *)(paVar4 + 0x10))) {
        uVar9 = lVar8 + *(long *)(paVar4 + 0x20);
        break;
      }
    }
    iVar3 = (*(this->super_segment)._vptr_segment[0xd])(this);
    uVar5 = CONCAT44(extraout_var_00,iVar3);
    uVar1 = this->stream_size;
    if ((((uVar9 <= uVar1) && (uVar5 <= uVar1)) && (uVar5 <= uVar1 - uVar9)) &&
       (uVar5 != 0xffffffffffffffff)) {
      pcVar6 = (char *)operator_new__(uVar5 + 1,(nothrow_t *)&std::nothrow);
      pcVar2 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
      (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl = pcVar6;
      if (pcVar2 != (char *)0x0) {
        operator_delete__(pcVar2);
      }
      std::istream::seekg(this->pstream,uVar9,0);
      pcVar2 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
      if ((pcVar2 != (char *)0x0) &&
         (plVar7 = (long *)std::istream::read((char *)this->pstream,(long)pcVar2),
         (*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0)) {
        (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl[uVar5] = '\0';
        this->is_loaded = true;
        return true;
      }
    }
    pcVar2 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
    (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl = (char *)0x0;
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool load_data() const
    {
        if ( PT_NULL == get_type() || 0 == get_file_size() ) {
            return true;
        }

        Elf_Xword p_offset = ( *translator )[( *convertor )( ph.p_offset )];
        Elf_Xword size     = get_file_size();

        // Check for integer overflow in offset calculation
        if (p_offset > get_stream_size()) {
            data = nullptr;
            return false;
        }

        // Check for integer overflow in size calculation
        if (size > get_stream_size() || 
            size > (get_stream_size() - p_offset)) {
            data = nullptr;
            return false;
        }

        // Check if size can be safely converted to size_t
        if (size > std::numeric_limits<size_t>::max() - 1) {
            data = nullptr;
            return false;
        }

        data.reset( new ( std::nothrow ) char[(size_t)size + 1] );

        pstream->seekg( p_offset );
        if ( nullptr != data.get() && pstream->read( data.get(), size ) ) {
            data.get()[size] = 0;
        }
        else {
            data = nullptr;
            return false;
        }

        is_loaded = true;

        return true;
    }